

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

void __thiscall Net::learn(Net *this,int global_iterations)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  reference piVar9;
  reference pvVar10;
  reference pvVar11;
  reference b;
  reference b_00;
  ostream *poVar12;
  reference pvVar13;
  void *this_00;
  double dVar14;
  undefined1 auVar15 [16];
  int local_204;
  double dStack_200;
  int op;
  double cost;
  value_type_conflict2 vStack_1f0;
  int layer_3;
  allocator<double> local_1e1;
  value_type_conflict2 local_1e0;
  undefined1 local_1d8 [8];
  vector<double,_std::allocator<double>_> y_1;
  int i_2;
  int j;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1a0;
  double local_188;
  vector<double,_std::allocator<double>_> local_180;
  double local_168;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_160;
  vector<double,_std::allocator<double>_> local_148;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_130;
  int local_114;
  double dStack_110;
  int layer_2;
  double divisor;
  vector<double,_std::allocator<double>_> local_f0;
  int local_d4;
  value_type_conflict2 vStack_d0;
  int layer_1;
  allocator<double> local_c1;
  value_type_conflict2 local_c0;
  undefined1 local_b8 [8];
  vector<double,_std::allocator<double>_> y;
  int local_98;
  int layer;
  int x;
  int i_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  derivative;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  bias_derivative;
  int i;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> cur_shuffle;
  int iStack_18;
  bool ok;
  int cur;
  int iteration;
  int global_iterations_local;
  Net *this_local;
  
  for (iStack_18 = 1; iStack_18 <= global_iterations; iStack_18 = iStack_18 + 1) {
    cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._3_1_ = 1;
    while (uVar6 = (ulong)cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,
          sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->shuffler), uVar6 < sVar7) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_38);
      iVar5 = cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ + this->shot;
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->shuffler);
      if (sVar7 < (ulong)(long)iVar5) {
        for (; uVar6 = (ulong)cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_,
            sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->shuffler), uVar6 < sVar7;
            cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->shuffler,
                              (long)cur_shuffle.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_38,pvVar8);
        }
      }
      else {
        for (bias_derivative.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                  cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
            (int)bias_derivative.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage <
            cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ + this->shot;
            bias_derivative.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)bias_derivative.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->shuffler,
                              (long)(int)bias_derivative.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_38,pvVar8);
        }
        cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             this->shot +
             cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&derivative.
                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->init_biases);
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                *)&__range3,&this->init);
      __end3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_38);
      _x = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)local_38);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&x), bVar4) {
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        iVar5 = *piVar9;
        local_98 = 0;
        while( true ) {
          pvVar11 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->mesh,0);
          sVar7 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
          if (sVar7 <= (ulong)(long)local_98) break;
          dVar14 = Table::get_value(&this->samples,local_98,iVar5);
          pvVar11 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->mesh,0);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)local_98)
          ;
          *pvVar13 = dVar14;
          local_98 = local_98 + 1;
        }
        for (y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ = 1;
            iVar3 = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_,
            sVar7 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::size(&this->mesh), iVar3 < (int)sVar7;
            y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ =
                 y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          propagate_front(this,y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
        }
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::back(&this->mesh);
        sVar7 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
        local_c0 = 0.0;
        std::allocator<double>::allocator(&local_c1);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_b8,sVar7,&local_c0,&local_c1);
        std::allocator<double>::~allocator(&local_c1);
        if (this->function_type == TANH) {
          pvVar11 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::back(&this->mesh);
          sVar7 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
          vStack_d0 = -1.0;
          std::vector<double,_std::allocator<double>_>::assign
                    ((vector<double,_std::allocator<double>_> *)local_b8,sVar7,
                     &stack0xffffffffffffff30);
        }
        dVar14 = Table::get_value(&this->answers,0,iVar5);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_b8,(long)(int)dVar14);
        *pvVar13 = 1.0;
        sVar7 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(&this->mesh);
        local_d4 = (int)sVar7;
        while (local_d4 = local_d4 + -1, iVar5 = local_d4, 0 < local_d4) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&divisor,
                     (vector<double,_std::allocator<double>_> *)local_b8);
          propagate_back(&local_f0,this,iVar5,(vector<double,_std::allocator<double>_> *)&divisor,
                         (vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          *)&__range3,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)&derivative.
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<double,_std::allocator<double>_>::operator=
                    ((vector<double,_std::allocator<double>_> *)local_b8,&local_f0);
          std::vector<double,_std::allocator<double>_>::~vector(&local_f0);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)&divisor);
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_b8);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      sVar7 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_38);
      auVar15._8_4_ = (int)(sVar7 >> 0x20);
      auVar15._0_8_ = sVar7;
      auVar15._12_4_ = 0x45300000;
      dStack_110 = 1.0 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
      for (local_114 = 1; iVar5 = local_114,
          sVar7 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size(&this->mesh), iVar5 < (int)sVar7; local_114 = local_114 + 1) {
        pvVar10 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                *)&__range3,(long)local_114);
        mult_matrix_on_constant<double>(&local_130,pvVar10,&stack0xfffffffffffffef0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_130);
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&derivative.
                                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)local_114);
        mult_matrix_on_constant<double>(&local_148,pvVar11,&stack0xfffffffffffffef0);
        std::vector<double,_std::allocator<double>_>::~vector(&local_148);
        pvVar10 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                *)&__range3,(long)local_114);
        local_168 = -1.0;
        mult_matrix_on_constant<double>(&local_160,pvVar10,&local_168);
        pvVar10 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                *)&__range3,(long)local_114);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator=(pvVar10,&local_160);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_160);
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&derivative.
                                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)local_114);
        local_188 = -1.0;
        mult_matrix_on_constant<double>(&local_180,pvVar11,&local_188);
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&derivative.
                                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)local_114);
        std::vector<double,_std::allocator<double>_>::operator=(pvVar11,&local_180);
        std::vector<double,_std::allocator<double>_>::~vector(&local_180);
        pvVar10 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[](&this->weights,(long)local_114);
        b = std::
            vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          *)&__range3,(long)local_114);
        add_matrix<double>(&local_1a0,pvVar10,b);
        pvVar10 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[](&this->weights,(long)local_114);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator=(pvVar10,&local_1a0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_1a0);
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->biases,(long)local_114);
        b_00 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&derivative.
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_114);
        add_matrix<double>((vector<double,_std::allocator<double>_> *)&i_2,pvVar11,b_00);
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->biases,(long)local_114);
        std::vector<double,_std::allocator<double>_>::operator=
                  (pvVar11,(vector<double,_std::allocator<double>_> *)&i_2);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)&i_2);
      }
      if (((cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) && (iStack_18 % 0x32 == 0)) {
        cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._3_1_ = 0;
        poVar12 = (ostream *)
                  std::ostream::operator<<(&std::cout,(double)iStack_18 / (double)global_iterations)
        ;
        poVar12 = std::operator<<(poVar12,"% finished");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        for (y_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage._4_4_ = 0;
            y_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ < 2;
            y_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ =
                 y_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_38,
                              (long)y_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          y_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = *pvVar8;
          pvVar11 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::back(&this->mesh);
          sVar7 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
          local_1e0 = 0.0;
          std::allocator<double>::allocator(&local_1e1);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_1d8,sVar7,&local_1e0,
                     &local_1e1);
          std::allocator<double>::~allocator(&local_1e1);
          if (this->function_type == TANH) {
            pvVar11 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::back(&this->mesh);
            sVar7 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
            vStack_1f0 = -1.0;
            std::vector<double,_std::allocator<double>_>::assign
                      ((vector<double,_std::allocator<double>_> *)local_1d8,sVar7,
                       &stack0xfffffffffffffe10);
          }
          dVar14 = Table::get_value(&this->answers,0,
                                    (value_type)
                                    y_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_1d8,
                               (long)(int)dVar14);
          *pvVar13 = 1.0;
          for (cost._4_4_ = 1;
              sVar7 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::size(&this->mesh), cost._4_4_ < (int)sVar7; cost._4_4_ = cost._4_4_ + 1) {
            propagate_front(this,cost._4_4_);
          }
          dStack_200 = 0.0;
          local_204 = 0;
          while( true ) {
            pvVar11 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::back(&this->mesh);
            sVar7 = std::vector<double,_std::allocator<double>_>::size(pvVar11);
            if (sVar7 <= (ulong)(long)local_204) break;
            pvVar11 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::back(&this->mesh);
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar11,(long)local_204);
            dVar14 = *pvVar13;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_1d8,
                                 (long)local_204);
            dVar1 = *pvVar13;
            pvVar11 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::back(&this->mesh);
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                (pvVar11,(long)local_204);
            dVar2 = *pvVar13;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_1d8,
                                 (long)local_204);
            dStack_200 = (dVar14 - dVar1) * (dVar2 - *pvVar13) + dStack_200;
            local_204 = local_204 + 1;
          }
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,iStack_18);
          poVar12 = std::operator<<(poVar12," iteration - COST: ");
          this_00 = (void *)std::ostream::operator<<(poVar12,dStack_200);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)local_1d8);
        }
      }
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 *)&__range3);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&derivative.
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38)
      ;
    }
  }
  return;
}

Assistant:

void Net::learn(int global_iterations){
    for (int iteration = 1; iteration <= global_iterations; ++iteration) {
        int cur = 0;
        bool ok = true;
        while (cur < shuffler.size()) {
            // get new shuffled data
            std::vector<int> cur_shuffle;
            if (cur + shot > shuffler.size()) {
                for (; cur < shuffler.size(); ++cur)
                    cur_shuffle.push_back(shuffler[cur]);
            } else {
                for (int i = cur; i < cur + shot; ++i)
                    cur_shuffle.push_back(shuffler[i]);
                cur += shot;
            }
            // front propagate each sample
            std::vector<Layer> bias_derivative = init_biases;
            std::vector<std::vector<Layer> > derivative = init;
            for (int i:cur_shuffle) {
                // front propagation
                for (int x = 0; x < mesh[0].size(); ++x)
                    mesh[0][x] = samples.get_value(x, i);
                for (int layer = 1; layer < (int) mesh.size(); ++layer)
                    propagate_front(layer);

                // right answer
                std::vector<double> y(mesh.back().size(), 0);
                if (function_type == TANH)
                    y.assign(mesh.back().size(), -1);
                y[(int) answers.get_value(0, i)] = 1;

//                // counting cost
//                double cost = 0;
//                for (int op = 0; op < mesh.back().size(); ++op)
//                    cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
//                std::cout << iteration << " iteration - COST: " << cost << std::endl;

                // back_propagation
                for (int layer = (int) mesh.size() - 1; layer >= 1; --layer)
                    y = propagate_back(layer, y, derivative, bias_derivative);
            }
            // get average sum
            double divisor = 1.0 / (double) cur_shuffle.size();
            for (int layer = 1; layer < (int) mesh.size(); ++layer) {
                mult_matrix_on_constant(derivative[layer], divisor);
                mult_matrix_on_constant(bias_derivative[layer], divisor);
                // updating weights

                derivative[layer] = mult_matrix_on_constant(derivative[layer], -1.0);
                bias_derivative[layer] = mult_matrix_on_constant(bias_derivative[layer], -1.);
                weights[layer] = add_matrix(weights[layer], derivative[layer]);
                biases[layer] = add_matrix(biases[layer], bias_derivative[layer]);
//                threshold(biases[layer], MOD);
//                for (int x = 0; x < mesh[layer].size(); ++x)
//                    threshold(weights[layer][x], MOD);
            }

            // learning results
            if (ok && iteration % 50 == 0) {
                ok = false;
                std::cout << (double)iteration / (double)global_iterations << "% finished" << std::endl;
                for (int j = 0; j < 2; ++j) {
                    int i = cur_shuffle[j];
                    std::vector<double> y(mesh.back().size(), 0);
                    if (function_type == TANH)
                        y.assign(mesh.back().size(), -1);
                    y[(int) answers.get_value(0, i)] = 1;
                    for (int layer = 1; layer < (int) mesh.size(); ++layer)
                        propagate_front(layer);
                    double cost = 0;
                    for (int op = 0; op < mesh.back().size(); ++op)
                        cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
                    std::cout << iteration << " iteration - COST: " << cost << std::endl;
                }
            }
        }
    }
}